

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pedersen_impl.h
# Opt level: O1

void secp256k1_pedersen_ecmult_small(secp256k1_gej *r,uint64_t gn,secp256k1_ge *genp)

{
  long lVar1;
  secp256k1_scalar s;
  uchar local_58 [32];
  secp256k1_scalar local_38;
  
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_58[0x14] = '\0';
  local_58[0x15] = '\0';
  local_58[0x16] = '\0';
  local_58[0x17] = '\0';
  lVar1 = 0x18;
  do {
    local_58[lVar1] = (uchar)(gn >> 0x38);
    gn = gn << 8;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x20);
  secp256k1_scalar_set_b32(&local_38,local_58,(int *)0x0);
  secp256k1_ecmult_const(r,genp,&local_38,0x40);
  return;
}

Assistant:

static void secp256k1_pedersen_ecmult_small(secp256k1_gej *r, uint64_t gn, const secp256k1_ge* genp) {
    secp256k1_scalar s;
    secp256k1_pedersen_scalar_set_u64(&s, gn);
    secp256k1_ecmult_const(r, genp, &s, 64);
    secp256k1_scalar_clear(&s);
}